

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O1

void getUnscaledInfeasibilities
               (HighsOptions *options,HighsScale *scale,SimplexBasis *basis,HighsSimplexInfo *info,
               HighsInfo *highs_info)

{
  HighsInt *pHVar1;
  double dVar2;
  uint uVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  dVar2 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  dVar16 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).max_primal_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = 0.0;
  (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).max_dual_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = 0.0;
  uVar3 = scale->num_col;
  uVar11 = (ulong)uVar3;
  iVar12 = scale->num_row + uVar3;
  if (iVar12 != 0 && SCARRY4(scale->num_row,uVar3) == iVar12 < 0) {
    lVar13 = 0;
    do {
      if ((basis->nonbasicFlag_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar13] != '\0') {
        dVar19 = (info->workLower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar13];
        dVar18 = (info->workUpper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar13];
        if ((dVar19 != dVar18) || (NAN(dVar19) || NAN(dVar18))) {
          if (lVar13 < (int)uVar11) {
            dVar17 = 1.0 / ((scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start[lVar13] / scale->cost);
          }
          else {
            dVar17 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)lVar13 - (int)uVar11] * scale->cost;
          }
          dVar17 = dVar17 * (info->workDual_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar13];
          bVar10 = highs_isInfinity(-dVar19);
          if (bVar10) {
            bVar10 = highs_isInfinity(dVar18);
            if (!bVar10) goto LAB_0036921b;
            dVar17 = ABS(dVar17);
          }
          else {
LAB_0036921b:
            dVar17 = dVar17 * (double)-(int)(basis->nonbasicMove_).
                                            super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar13];
          }
          if (0.0 < dVar17) {
            if (dVar16 <= dVar17) {
              pHVar1 = &(highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
              *pHVar1 = *pHVar1 + 1;
            }
            dVar19 = (highs_info->super_HighsInfoStruct).max_dual_infeasibility;
            uVar14 = SUB84(dVar19,0);
            uVar15 = (undefined4)((ulong)dVar19 >> 0x20);
            if (dVar19 <= dVar17) {
              uVar14 = SUB84(dVar17,0);
              uVar15 = (undefined4)((ulong)dVar17 >> 0x20);
            }
            (highs_info->super_HighsInfoStruct).max_dual_infeasibility =
                 (double)CONCAT44(uVar15,uVar14);
            (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities =
                 dVar17 + (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities;
          }
        }
      }
      lVar13 = lVar13 + 1;
      uVar11 = (ulong)scale->num_col;
    } while (lVar13 < (long)((long)scale->num_row + uVar11));
  }
  if (0 < scale->num_row) {
    dVar16 = (highs_info->super_HighsInfoStruct).max_primal_infeasibility;
    uVar14 = SUB84(dVar16,0);
    uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
    dVar16 = (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities;
    piVar4 = (basis->basicIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (info->baseLower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (info->baseUpper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (info->baseValue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      iVar12 = piVar4[lVar13];
      if (iVar12 < scale->num_col) {
        dVar19 = pdVar5[iVar12];
      }
      else {
        dVar19 = 1.0 / pdVar6[iVar12 - scale->num_col];
      }
      dVar18 = pdVar7[lVar13] * dVar19;
      dVar17 = pdVar9[lVar13] * dVar19;
      if (dVar18 - dVar2 <= dVar17) {
        dVar19 = dVar19 * pdVar8[lVar13];
        dVar18 = 0.0;
        if (dVar2 + dVar19 < dVar17) {
          dVar18 = dVar17 - dVar19;
        }
      }
      else {
        dVar18 = dVar18 - dVar17;
      }
      if (0.0 < dVar18) {
        pHVar1 = &(highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
        *pHVar1 = *pHVar1 + 1;
        if ((double)CONCAT44(uVar15,uVar14) <= dVar18) {
          uVar14 = SUB84(dVar18,0);
          uVar15 = (undefined4)((ulong)dVar18 >> 0x20);
        }
        (highs_info->super_HighsInfoStruct).max_primal_infeasibility =
             (double)CONCAT44(uVar15,uVar14);
        dVar16 = dVar16 + dVar18;
        (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = dVar16;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < scale->num_row);
  }
  iVar12 = (highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
  if (iVar12 < 0) {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 0;
  }
  else if (iVar12 == 0) {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 2;
  }
  else {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 1;
  }
  iVar12 = (highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
  if (iVar12 < 0) {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 0;
  }
  else if (iVar12 == 0) {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 2;
  }
  else {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 1;
  }
  return;
}

Assistant:

void getUnscaledInfeasibilities(const HighsOptions& options,
                                const HighsScale& scale,
                                const SimplexBasis& basis,
                                const HighsSimplexInfo& info,
                                HighsInfo& highs_info) {
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;

  HighsInt& num_primal_infeasibilities = highs_info.num_primal_infeasibilities;
  double& max_primal_infeasibility = highs_info.max_primal_infeasibility;
  double& sum_primal_infeasibilities = highs_info.sum_primal_infeasibilities;
  HighsInt& num_dual_infeasibilities = highs_info.num_dual_infeasibilities;
  double& max_dual_infeasibility = highs_info.max_dual_infeasibility;
  double& sum_dual_infeasibilities = highs_info.sum_dual_infeasibilities;

  // Zero the counts of unscaled primal and dual infeasibilities
  num_primal_infeasibilities = 0;
  max_primal_infeasibility = 0;
  sum_primal_infeasibilities = 0;
  num_dual_infeasibilities = 0;
  max_dual_infeasibility = 0;
  sum_dual_infeasibilities = 0;

  double scale_mu = 1.0;
  assert(int(scale.col.size()) == scale.num_col);
  assert(int(scale.row.size()) == scale.num_row);
  for (HighsInt iVar = 0; iVar < scale.num_col + scale.num_row; iVar++) {
    // Look at the dual infeasibilities of nonbasic variables
    if (basis.nonbasicFlag_[iVar] == kNonbasicFlagFalse) continue;
    // No dual infeasibility for fixed rows and columns
    if (info.workLower_[iVar] == info.workUpper_[iVar]) continue;
    bool col = iVar < scale.num_col;
    HighsInt iCol = 0;
    HighsInt iRow = 0;
    if (col) {
      iCol = iVar;
      assert(int(scale.col.size()) > iCol);
      scale_mu = 1 / (scale.col[iCol] / scale.cost);
    } else {
      iRow = iVar - scale.num_col;
      assert(int(scale.row.size()) > iRow);
      scale_mu = scale.row[iRow] * scale.cost;
    }
    const double dual = info.workDual_[iVar];
    const double lower = info.workLower_[iVar];
    const double upper = info.workUpper_[iVar];
    const double unscaled_dual = dual * scale_mu;

    double dual_infeasibility;
    if (highs_isInfinity(-lower) && highs_isInfinity(upper)) {
      // Free: any nonzero dual value is infeasible
      dual_infeasibility = fabs(unscaled_dual);
    } else {
      // Not fixed: any dual infeasibility is given by value signed by
      // nonbasicMove. This assumes that nonbasicMove=0 for fixed
      // variables
      dual_infeasibility = -basis.nonbasicMove_[iVar] * unscaled_dual;
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= dual_feasibility_tolerance)
        num_dual_infeasibilities++;
      max_dual_infeasibility = max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibilities += dual_infeasibility;
    }
  }
  // Look at the primal infeasibilities of basic variables
  for (HighsInt ix = 0; ix < scale.num_row; ix++) {
    HighsInt iVar = basis.basicIndex_[ix];
    bool col = iVar < scale.num_col;
    HighsInt iCol = 0;
    HighsInt iRow = 0;
    if (col) {
      iCol = iVar;
      scale_mu = scale.col[iCol];
    } else {
      iRow = iVar - scale.num_col;
      scale_mu = 1 / scale.row[iRow];
    }
    double unscaled_lower = info.baseLower_[ix] * scale_mu;
    double unscaled_value = info.baseValue_[ix] * scale_mu;
    double unscaled_upper = info.baseUpper_[ix] * scale_mu;
    // @primal_infeasibility calculation
    double primal_infeasibility = 0;
    if (unscaled_value < unscaled_lower - primal_feasibility_tolerance) {
      primal_infeasibility = unscaled_lower - unscaled_value;
    } else if (unscaled_value > unscaled_upper + primal_feasibility_tolerance) {
      primal_infeasibility = unscaled_value - unscaled_upper;
    }
    if (primal_infeasibility > 0) {
      num_primal_infeasibilities++;
      max_primal_infeasibility =
          max(primal_infeasibility, max_primal_infeasibility);
      sum_primal_infeasibilities += primal_infeasibility;
    }
  }
  setSolutionStatus(highs_info);
}